

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O2

string * PrintTools::SoftPrintVector<unsigned_long>
                   (string *__return_storage_ptr__,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  pointer puVar1;
  pointer puVar2;
  stringstream ss;
  string local_360 [32];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_340);
  puVar2 = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::operator<<(local_330,"< ");
  for (; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    if (puVar2 != (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start) {
      std::operator<<(local_330,", ");
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::operator<<(local_330,local_360);
    std::__cxx11::string::~string(local_360);
  }
  std::operator<<(local_330," >");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  return __return_storage_ptr__;
}

Assistant:

static std::string SoftPrintVector(const std::vector<T> &v)
{
    std::stringstream ss;
    typename std::vector<T>::const_iterator it =  v.begin();
    typename std::vector<T>::const_iterator last =  v.end();
    ss << "< ";
    while(it != last)
    {
        if(it != v.begin())
            ss << ", ";

        ss << SoftPrintVector(*it);        
        it++;
    }
    ss << " >";
    return(ss.str());
}